

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O0

unsigned_long
mxx::scatter_one<unsigned_long>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *msgs,int root,comm *comm)

{
  int iVar1;
  size_type sVar2;
  const_reference msgs_00;
  unsigned_long local_28;
  unsigned_long result;
  comm *comm_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvStack_10;
  int root_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *msgs_local;
  
  result = (unsigned_long)comm;
  comm_local._4_4_ = root;
  pvStack_10 = msgs;
  iVar1 = mxx::comm::rank(comm);
  if (iVar1 == comm_local._4_4_) {
    sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvStack_10);
    iVar1 = mxx::comm::size((comm *)result);
    if (sVar2 != (long)iVar1) {
      assert_fail("comm.rank() != root || msgs.size() == static_cast<size_t>(comm.size())",
                  "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/collective.hpp"
                  ,0xfe,"scatter_one");
    }
  }
  msgs_00 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvStack_10,0);
  scatter<unsigned_long>(msgs_00,1,&local_28,comm_local._4_4_,(comm *)result);
  return local_28;
}

Assistant:

T scatter_one(const std::vector<T>& msgs, int root, const mxx::comm& comm = mxx::comm()) {
    MXX_ASSERT(comm.rank() != root || msgs.size() == static_cast<size_t>(comm.size()));
    T result;
    scatter(&msgs[0], 1, &result, root, comm);
    return result;
}